

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O3

void stl(double *x,int N,int f,char *s_window_type,int *s_window,int *s_degree,int *t_window,
        int *t_degree,int *l_window,int *l_degree,int *s_jump,int *t_jump,int *l_jump,int *robust,
        int *inner,int *outer,double *seasonal,double *trend,double *remainder)

{
  int *piVar1;
  uint uVar2;
  double *rw;
  double *work;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  char *__s;
  uint uVar8;
  uint uVar9;
  size_t __nmemb;
  bool bVar10;
  double dVar11;
  double dVar12;
  uint local_78;
  int local_74;
  int N_local;
  uint local_6c;
  uint local_68;
  int t_window_;
  int l_window_;
  int local_5c;
  int s_jump_;
  int t_jump_;
  int l_jump_;
  int local_4c;
  int outer_;
  undefined8 local_40;
  int local_38;
  uint local_34;
  int f_local;
  int t_degree_;
  
  local_78 = N;
  local_38 = f;
  if (1 < f) {
    uVar7 = (ulong)(uint)N;
    if (f * 2 <= N) {
      local_4c = strcmp(s_window_type,"period");
      _outer_ = (double *)uVar7;
      if (local_4c == 0) {
        iVar6 = N * 10 + 1;
      }
      else {
        if (s_window == (int *)0x0) {
          __s = "Error. Either set s_window_type to period or assign an integer value to s_window ";
          goto LAB_0014b223;
        }
        iVar6 = *s_window;
      }
      dVar12 = 0.0;
      local_74 = iVar6;
      if (t_window == (int *)0x0) {
        dVar12 = ceil(((double)f * 1.5) / (1.0 - 1.5 / (double)iVar6));
        local_6c = (int)dVar12 | 1;
        dVar12 = (double)(int)local_6c;
      }
      if (s_degree == (int *)0x0) {
        local_40 = (double *)((ulong)local_40._4_4_ << 0x20);
      }
      else {
        local_40 = (double *)CONCAT44(local_40._4_4_,*s_degree);
      }
      if (t_degree == (int *)0x0) {
        uVar9 = 1;
      }
      else {
        uVar9 = *t_degree;
      }
      local_34 = uVar9;
      if (l_window == (int *)0x0) {
        uVar8 = f | 1;
      }
      else {
        uVar8 = *l_window;
      }
      if (l_degree == (int *)0x0) {
        l_degree = (int *)&local_34;
      }
      uVar2 = *l_degree;
      local_68 = uVar8;
      if (s_jump == (int *)0x0) {
        dVar11 = ceil((double)iVar6 / 10.0);
      }
      else {
        dVar11 = (double)*s_jump;
      }
      l_window_ = (int)dVar11;
      if (t_jump == (int *)0x0) {
        dVar12 = ceil(dVar12 / 10.0);
      }
      else {
        dVar12 = (double)*t_jump;
      }
      local_5c = (int)dVar12;
      if (l_jump == (int *)0x0) {
        dVar12 = ceil((double)(int)uVar8 / 10.0);
      }
      else {
        dVar12 = (double)*l_jump;
      }
      s_jump_ = (int)dVar12;
      if (robust == (int *)0x0) {
        bVar10 = true;
      }
      else {
        bVar10 = *robust == 0;
      }
      if (inner == (int *)0x0) {
        t_jump_ = bVar10 + 1;
        l_jump_ = 0xf;
        if (bVar10 != false) {
          l_jump_ = 0;
        }
      }
      else {
        t_jump_ = *inner;
        l_jump_ = *outer;
      }
      if ((((uint)local_40 < 2) && (N_local = (uint)local_40, uVar9 < 2)) &&
         (local_34 = uVar9, uVar2 < 2)) {
        iVar6 = (int)_outer_;
        t_window_ = uVar2;
        rw = (double *)calloc((long)iVar6,8);
        work = (double *)calloc((long)((f * 2 + iVar6) * 5),8);
        __ptr = calloc((long)iVar6,4);
        _outer_ = rw;
        local_40 = work;
        stl_(x,(int *)&local_78,&local_38,&local_74,(int *)&local_6c,(int *)&local_68,&N_local,
             (int *)&local_34,&t_window_,&l_window_,&local_5c,&s_jump_,&t_jump_,&l_jump_,rw,seasonal
             ,trend,work);
        iVar6 = local_38;
        uVar9 = local_78;
        uVar7 = (ulong)local_78;
        if (local_4c == 0) {
          __nmemb = (size_t)local_38;
          if (0 < (int)local_78) {
            uVar4 = 0;
            do {
              *(int *)((long)__ptr + uVar4 * 4) =
                   (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) %
                        (long)local_38);
              uVar4 = uVar4 + 1;
            } while (uVar7 != uVar4);
          }
          __ptr_00 = calloc(__nmemb,__nmemb * 8);
          __ptr_01 = calloc(__nmemb,__nmemb * 4);
          if (0 < (int)uVar9) {
            uVar4 = 0;
            do {
              lVar5 = (long)*(int *)((long)__ptr + uVar4 * 4);
              piVar1 = (int *)((long)__ptr_01 + lVar5 * 4);
              *piVar1 = *piVar1 + 1;
              *(double *)((long)__ptr_00 + lVar5 * 8) =
                   seasonal[uVar4] + *(double *)((long)__ptr_00 + lVar5 * 8);
              uVar4 = uVar4 + 1;
            } while (uVar7 != uVar4);
          }
          if (0 < iVar6) {
            sVar3 = 0;
            do {
              *(double *)((long)__ptr_00 + sVar3 * 8) =
                   *(double *)((long)__ptr_00 + sVar3 * 8) /
                   (double)*(int *)((long)__ptr_01 + sVar3 * 4);
              sVar3 = sVar3 + 1;
            } while (__nmemb != sVar3);
          }
          if (0 < (int)uVar9) {
            uVar4 = 0;
            do {
              seasonal[uVar4] =
                   *(double *)((long)__ptr_00 + (long)*(int *)((long)__ptr + uVar4 * 4) * 8);
              uVar4 = uVar4 + 1;
            } while (uVar7 != uVar4);
          }
          free(__ptr_00);
          free(__ptr_01);
        }
        if (0 < (int)uVar9) {
          uVar4 = 0;
          do {
            remainder[uVar4] = (x[uVar4] - seasonal[uVar4]) - trend[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar7 != uVar4);
        }
        free(_outer_);
        free(local_40);
        free(__ptr);
        return;
      }
      __s = "Degree must be either 0 or 1 ";
      goto LAB_0014b223;
    }
  }
  __s = "Series is not periodic or has less than two periods. ";
LAB_0014b223:
  puts(__s);
  exit(-1);
}

Assistant:

void stl(double *x,int N,int f, const char *s_window_type,int *s_window, int *s_degree, int *t_window, int *t_degree,int *l_window,int *l_degree,
    int *s_jump, int *t_jump, int *l_jump, int *robust,int *inner, int *outer,double *seasonal,double *trend, double *remainder) {
    
    double *rw,*work;
    int *seas_cycle;
    int i;
    int s_window_,s_degree_,t_window_,t_degree_,l_window_,l_degree_,s_jump_,t_jump_,l_jump_,inner_,outer_,periodic_,robust_;

    if (f < 2 || N < 2*f) {
        printf("Series is not periodic or has less than two periods. \n");
        exit(-1);
    }

    //Default Values

    periodic_ = 0;

    if (!strcmp(s_window_type,"period")) {
        periodic_ = 1;
        s_window_ = 10 * N + 1;
        s_degree_ = 0;
    } else {
        if (s_window == NULL) {
            printf("Error. Either set s_window_type to period or assign an integer value to s_window \n");
            exit(-1);
        } else {
            s_window_ = *s_window;
        }
    }

    if (t_window == NULL) {
        t_window_ = nextOdd(ceil( 1.5 * f / (1.0 - 1.5 / (double) s_window_)));
    }

    s_degree_ = (s_degree == NULL) ? 0 : *s_degree;

    //if (t_window == NULL) *t_window = 0;
    t_degree_ = (t_degree == NULL) ? 1 : *t_degree;
    l_window_ = (l_window == NULL) ? nextOdd(f) : *l_window;
    l_degree_ = (l_degree == NULL) ? t_degree_ : *l_degree;
    s_jump_ = (s_jump == NULL) ? ceil((double)s_window_ / 10.0) : *s_jump;
    t_jump_ = (t_jump == NULL) ? ceil((double)t_window_ / 10.0) : *t_jump;
    l_jump_ = (l_jump == NULL) ? ceil((double)l_window_ / 10.0) : *l_jump;

    robust_ = (robust == NULL) ? 0 : *robust;
    inner_ = (inner == NULL) ? (robust_ ? 1 : 2) : *inner;
    outer_ = (inner == NULL) ? (robust_ ? 15 : 0) : *outer;

    
    s_degree_ = degCheck(s_degree_);
    t_degree_ = degCheck(t_degree_);
    l_degree_ = degCheck(l_degree_);

    

    // Initialize work vectors

    rw = (double*)calloc(N,sizeof(double));
    work = (double*)calloc((N+2*f)*5,sizeof(double));
    seas_cycle = (int*)calloc(N,sizeof(int));


    stl_(x,&N,&f,&s_window_,&t_window_,&l_window_,&s_degree_,&t_degree_,&l_degree_,&s_jump_,&t_jump_,&l_jump_,&inner_,&outer_,rw,seasonal,trend,work);
	

    if (periodic_) {
        cycle(N,f,seas_cycle);
        applySeasonalMean(seasonal,N,seas_cycle,f);
    }

    for (i = 0; i < N;++i) {
        remainder[i] = x[i] - seasonal[i] - trend[i];
    }

    free(rw);
    free(work);
    free(seas_cycle);
}